

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderIncompleteGSTest::iterate(GeometryShaderIncompleteGSTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_type sVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  char *local_368;
  char *local_360;
  char *local_358;
  MessageBuilder local_350;
  int local_1cc;
  undefined1 local_1c8 [4];
  GLint link_status;
  bool local_43;
  bool local_42;
  bool local_41;
  bool has_vs_compiled;
  bool has_gs_compiled;
  reference pvStack_40;
  bool has_fs_compiled;
  _run *current_run;
  long lStack_30;
  uint run_index;
  Functions *gl;
  byte local_11;
  GeometryShaderIncompleteGSTest *pGStack_10;
  bool result;
  GeometryShaderIncompleteGSTest *this_local;
  
  local_11 = 1;
  pGStack_10 = this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x1c4);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTestRuns(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  current_run._4_4_ = 0;
  do {
    uVar5 = (ulong)current_run._4_4_;
    sVar6 = std::
            vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
            ::size(&this->m_test_runs);
    if (sVar6 <= uVar5) {
LAB_015bf837:
      if ((local_11 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    pvStack_40 = std::
                 vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
                 ::operator[](&this->m_test_runs,(ulong)current_run._4_4_);
    deinitSOs(this);
    local_41 = false;
    local_42 = false;
    local_43 = false;
    initShaderObjects(this,pvStack_40,&local_41,&local_42,&local_43);
    if (((local_41 & 1U) == 0) || ((local_43 & 1U) == 0)) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1c8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1c8,
                          (char (*) [43])"Dummy FS and/or dummy VS failed to compile");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1c8);
      local_11 = 0;
      goto LAB_015bf837;
    }
    GVar2 = (**(code **)(lStack_30 + 0x3c8))();
    this->m_po_id = GVar2;
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glCreateProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1e6);
    (**(code **)(lStack_30 + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(lStack_30 + 0x10))(this->m_po_id,this->m_gs_id);
    (**(code **)(lStack_30 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glAttachShader() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1ec);
    (**(code **)(lStack_30 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1f0);
    local_1cc = 0;
    (**(code **)(lStack_30 + 0x9d8))(this->m_po_id,0x8b82,&local_1cc);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1f6);
    if (local_1cc == 1) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_350,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_350,
                          (char (*) [61])
                          "PO with a malformed Geometry Shader was linked successfully.");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [25])" [input primitive type]:");
      local_358 = "NOT DEFINED";
      if ((pvStack_40->is_input_primitive_type_defined & 1U) != 0) {
        local_358 = "DEFINED";
      }
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_358);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [26])" [output primitive type]:");
      local_360 = "NOT DEFINED";
      if ((pvStack_40->is_output_primitive_type_defined & 1U) != 0) {
        local_360 = "DEFINED";
      }
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_360);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [17])" [max_vertices]:");
      local_368 = "NOT DEFINED";
      if ((pvStack_40->is_max_vertices_defined & 1U) != 0) {
        local_368 = "DEFINED";
      }
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_368);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      local_11 = 0;
    }
    (**(code **)(lStack_30 + 0x448))(this->m_po_id);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glDeleteProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x209);
    current_run._4_4_ = current_run._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteGSTest::iterate()
{
	bool result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize test runs */
	initTestRuns();

	/* Iterate over the test run set */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int run_index = 0; run_index < m_test_runs.size(); ++run_index)
	{
		const _run& current_run = m_test_runs[run_index];

		/* Release shader objects initialized in previous iterations */
		deinitSOs();

		/* Set up shader objects */
		bool has_fs_compiled = false;
		bool has_gs_compiled = false;
		bool has_vs_compiled = false;

		initShaderObjects(current_run, &has_fs_compiled, &has_gs_compiled, &has_vs_compiled);

		if (!has_fs_compiled || !has_vs_compiled)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Dummy FS and/or dummy VS failed to compile"
							   << tcu::TestLog::EndMessage;

			result = false;
			break;
		}

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		gl.attachShader(m_po_id, m_fs_id);
		gl.attachShader(m_po_id, m_gs_id);
		gl.attachShader(m_po_id, m_vs_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "PO with a malformed Geometry Shader was linked successfully."
							   << " [input primitive type]:"
							   << ((current_run.is_input_primitive_type_defined) ? "DEFINED" : "NOT DEFINED")
							   << " [output primitive type]:"
							   << ((current_run.is_output_primitive_type_defined) ? "DEFINED" : "NOT DEFINED")
							   << " [max_vertices]:"
							   << ((current_run.is_max_vertices_defined) ? "DEFINED" : "NOT DEFINED")
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Clean up for the next iteration */
		gl.deleteProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed");
	} /* for (all test runs) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}